

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

void __thiscall
Wasm::WasmSignature::AllocateParams(WasmSignature *this,ArgSlot count,Recycler *recycler)

{
  Recycler *this_00;
  WasmType *ptr;
  WasmCompilationException *this_01;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->m_paramsCount == 0) {
    if (count != 0) {
      local_48 = (undefined1  [8])&WasmTypes::WasmType::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_afd287d;
      data.filename._0_4_ = 0x1e;
      data.plusSize = (ulong)count;
      this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
      ptr = Memory::AllocateArray<Memory::Recycler,Wasm::WasmTypes::WasmType,false>
                      ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)count)
      ;
      Memory::WriteBarrierPtr<Wasm::WasmTypes::WasmType>::WriteBarrierSet(&this->m_params,ptr);
    }
    this->m_paramsCount = count;
    return;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"Invalid call to WasmSignature::AllocateParams: Params are already allocated")
  ;
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmSignature::AllocateParams(Js::ArgSlot count, Recycler * recycler)
{
    if (GetParamCount() != 0)
    {
        throw WasmCompilationException(_u("Invalid call to WasmSignature::AllocateParams: Params are already allocated"));
    }
    if (count > 0)
    {
        m_params = RecyclerNewArrayLeafZ(recycler, Local, count);
    }
    m_paramsCount = count;
}